

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

void __thiscall randomx::Cpu::Cpu(Cpu *this)

{
  uint *puVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  
  this->aes_ = false;
  this->ssse3_ = false;
  this->avx2_ = false;
  puVar1 = (uint *)cpuid_basic_info(0);
  uVar3 = *puVar1;
  if (0 < (int)uVar3) {
    lVar2 = cpuid_Version_info(1);
    uVar4 = *(uint *)(lVar2 + 0xc);
    this->ssse3_ = (bool)((byte)(uVar4 >> 9) & 1);
    this->aes_ = (bool)((byte)(uVar4 >> 0x19) & 1);
    if (6 < uVar3) {
      lVar2 = cpuid_Extended_Feature_Enumeration_info(7);
      this->avx2_ = (bool)((byte)*(undefined4 *)(lVar2 + 4) >> 5 & 1);
    }
  }
  return;
}

Assistant:

Cpu::Cpu() : aes_(false), ssse3_(false), avx2_(false) {
#ifdef HAVE_CPUID
		int info[4];
		cpuid(info, 0);
		int nIds = info[0];
		if (nIds >= 0x00000001) {
			cpuid(info, 0x00000001);
			ssse3_ = (info[2] & (1 << 9)) != 0;
			aes_ = (info[2] & (1 << 25)) != 0;
		}
		if (nIds >= 0x00000007) {
			cpuid(info, 0x00000007);
			avx2_ = (info[1] & (1 << 5)) != 0;
		}
#elif defined(__aarch64__)
	#if defined(HWCAP_AES)
		long hwcaps = getauxval(AT_HWCAP);
		aes_ = (hwcaps & HWCAP_AES) != 0;
	#elif defined(__APPLE__)
		aes_ = true;
	#endif
#endif
		//TODO POWER8 AES
	}